

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureFormatTests.cpp
# Opt level: O2

int __thiscall
deqp::gles3::Functional::CompressedCubeFormatCase::init
          (CompressedCubeFormatCase *this,EVP_PKEY_CTX *ctx)

{
  pointer puVar1;
  deUint32 dVar2;
  int extraout_EAX;
  TextureCube *this_00;
  ulong uVar3;
  int face;
  long lVar4;
  uint uVar5;
  vector<tcu::CompressedTexture,_std::allocator<tcu::CompressedTexture>_> levels;
  TexDecompressionParams local_44;
  Random rnd;
  
  std::vector<tcu::CompressedTexture,_std::allocator<tcu::CompressedTexture>_>::vector
            (&levels,6,(allocator_type *)&rnd);
  deRandom_init(&rnd.m_rnd,this->m_randomSeed);
  for (lVar4 = 0; lVar4 != 6; lVar4 = lVar4 + 1) {
    tcu::CompressedTexture::setStorage
              (levels.
               super__Vector_base<tcu::CompressedTexture,_std::allocator<tcu::CompressedTexture>_>.
               _M_impl.super__Vector_impl_data._M_start + lVar4,this->m_format,this->m_width,
               this->m_height,1);
    puVar1 = levels.
             super__Vector_base<tcu::CompressedTexture,_std::allocator<tcu::CompressedTexture>_>.
             _M_impl.super__Vector_impl_data._M_start[lVar4].m_data.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar5 = *(int *)&levels.
                     super__Vector_base<tcu::CompressedTexture,_std::allocator<tcu::CompressedTexture>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar4].m_data.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish - (int)puVar1;
    if ((int)uVar5 < 1) {
      uVar5 = 0;
    }
    for (uVar3 = 0; uVar5 != uVar3; uVar3 = uVar3 + 1) {
      dVar2 = deRandom_getUint32(&rnd.m_rnd);
      puVar1[uVar3] = (uchar)dVar2;
    }
  }
  this_00 = (TextureCube *)operator_new(0x180);
  local_44.astcMode = ASTCMODE_LAST;
  glu::TextureCube::TextureCube
            (this_00,this->m_renderCtx,this->m_renderCtxInfo,1,
             levels.
             super__Vector_base<tcu::CompressedTexture,_std::allocator<tcu::CompressedTexture>_>.
             _M_impl.super__Vector_impl_data._M_start,&local_44);
  this->m_texture = this_00;
  this->m_curFace = 0;
  this->m_isOk = true;
  std::vector<tcu::CompressedTexture,_std::allocator<tcu::CompressedTexture>_>::~vector(&levels);
  return extraout_EAX;
}

Assistant:

void CompressedCubeFormatCase::init (void)
{
	vector<tcu::CompressedTexture>	levels	(tcu::CUBEFACE_LAST);
	de::Random						rnd		(m_randomSeed);

	for (int face = 0; face < tcu::CUBEFACE_LAST; face++)
	{
		levels[face].setStorage(m_format, m_width, m_height);

		int			dataSize	= levels[face].getDataSize();
		deUint8*	data		= (deUint8*)levels[face].getData();

		for (int i = 0; i < dataSize; i++)
			data[i] = rnd.getUint32() & 0xff;
	}

	m_texture = new glu::TextureCube(m_renderCtx, m_renderCtxInfo, 1, &levels[0]);

	m_curFace	= 0;
	m_isOk		= true;
}